

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

float __thiscall deqp::gls::DrawTest::getColorScale(DrawTest *this,DrawTestSpec *spec)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  const_reference __src;
  GLValue GVar4;
  float local_70;
  float local_6c;
  byte local_65;
  GLValue local_60;
  float local_50;
  byte local_49;
  float max;
  int iStack_44;
  bool isPositionAttr;
  AttributeSpec attribSpec;
  int arrayNdx;
  float colorScale;
  DrawTestSpec *spec_local;
  DrawTest *this_local;
  
  attribSpec.useDefaultAttribute = false;
  attribSpec.additionalPositionAttribute = false;
  attribSpec.bgraComponentOrder = true;
  attribSpec._39_1_ = 0x3f;
  for (attribSpec.instanceDivisor = 1; iVar1 = attribSpec.instanceDivisor,
      sVar3 = std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ::size(&spec->attribs), iVar1 < (int)sVar3;
      attribSpec.instanceDivisor = attribSpec.instanceDivisor + 1) {
    __src = std::
            vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            ::operator[](&spec->attribs,(long)attribSpec.instanceDivisor);
    memcpy(&max,__src,0x28);
    local_65 = 1;
    if (attribSpec.instanceDivisor != 0) {
      local_65 = attribSpec._29_1_;
    }
    local_49 = local_65 & 1;
    if (local_49 == 0) {
      if (max == 1.4013e-44) {
        if (((byte)attribSpec.offset & 1) == 0) {
          attribSpec._36_4_ = (float)attribSpec._36_4_ * 0.0009765625;
        }
      }
      else if (max == 1.54143e-44) {
        if (((byte)attribSpec.offset & 1) == 0) {
          attribSpec._36_4_ = (float)attribSpec._36_4_ * 0.001953125;
        }
      }
      else {
        GVar4 = anon_unknown_1::GLValue::getMaxValue((InputType)max);
        local_60.field_1 = GVar4.field_1;
        local_60.type = GVar4.type;
        local_50 = anon_unknown_1::GLValue::toFloat(&local_60);
        if ((((byte)attribSpec.offset & 1) == 0) ||
           (bVar2 = anon_unknown_1::inputTypeIsFloatType((InputType)max), bVar2)) {
          local_6c = 1.0 / local_50;
        }
        else {
          local_6c = 1.0;
        }
        attribSpec._36_4_ = local_6c * (float)attribSpec._36_4_;
        if (((iStack_44 == 3) || (iStack_44 == 0xb)) || (iStack_44 == 8)) {
          if ((((byte)attribSpec.offset & 1) == 0) ||
             (bVar2 = anon_unknown_1::inputTypeIsFloatType((InputType)max), bVar2)) {
            local_70 = 1.0 / local_50;
          }
          else {
            local_70 = 1.0;
          }
          attribSpec._36_4_ = local_70 * (float)attribSpec._36_4_;
        }
      }
    }
  }
  return (float)attribSpec._36_4_;
}

Assistant:

float DrawTest::getColorScale (const DrawTestSpec& spec) const
{
	float colorScale = 1.0f;

	for (int arrayNdx = 1; arrayNdx < (int)spec.attribs.size(); arrayNdx++)
	{
		DrawTestSpec::AttributeSpec attribSpec		= spec.attribs[arrayNdx];
		const bool					isPositionAttr	= (arrayNdx == 0) || (attribSpec.additionalPositionAttribute);

		if (isPositionAttr)
			continue;

		if (attribSpec.inputType == DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10)
		{
			if (!attribSpec.normalize)
				colorScale *= 1.0f / 1024.0f;
		}
		else if (attribSpec.inputType == DrawTestSpec::INPUTTYPE_INT_2_10_10_10)
		{
			if (!attribSpec.normalize)
				colorScale *= 1.0f / 512.0f;
		}
		else
		{
			const float max = GLValue::getMaxValue(attribSpec.inputType).toFloat();

			colorScale *= (attribSpec.normalize && !inputTypeIsFloatType(attribSpec.inputType) ? 1.0f : float(1.0 / double(max)));
			if (attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_VEC4 ||
				attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_UVEC4 ||
				attribSpec.outputType == DrawTestSpec::OUTPUTTYPE_IVEC4)
				colorScale *= (attribSpec.normalize && !inputTypeIsFloatType(attribSpec.inputType) ? 1.0f : float(1.0 / double(max)));
		}
	}

	return colorScale;
}